

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

void kj::UnixEventPort::setReservedSignal(int signum)

{
  Fault f;
  Fault local_10;
  
  if ((anonymous_namespace)::tooLateToSetReserved == '\x01') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[120]>
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xfd,FAILED,"!tooLateToSetReserved",
               "\"setReservedSignal() must be called before any calls to `captureSignal()` and \" \"before any `UnixEventPort` is constructed.\""
               ,(char (*) [120])
                "setReservedSignal() must be called before any calls to `captureSignal()` and before any `UnixEventPort` is constructed."
              );
    kj::_::Debug::Fault::fatal(&local_10);
  }
  if ((anonymous_namespace)::reservedSignal == signum || (anonymous_namespace)::reservedSignal == 10
     ) {
    (anonymous_namespace)::reservedSignal = signum;
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[136]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x100,FAILED,(char *)0x0,
             "\"Detected multiple conflicting calls to setReservedSignal().  Please only \" \"call this once, or always call it with the same signal number.\""
             ,(char (*) [136])
              "Detected multiple conflicting calls to setReservedSignal().  Please only call this once, or always call it with the same signal number."
            );
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

void UnixEventPort::setReservedSignal(int signum) {
  KJ_REQUIRE(!tooLateToSetReserved,
             "setReservedSignal() must be called before any calls to `captureSignal()` and "
             "before any `UnixEventPort` is constructed.");
  if (reservedSignal != SIGUSR1 && reservedSignal != signum) {
    KJ_FAIL_REQUIRE("Detected multiple conflicting calls to setReservedSignal().  Please only "
                    "call this once, or always call it with the same signal number.");
  }
  reservedSignal = signum;
}